

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.c
# Opt level: O2

int nn_device_loopback(nn_device_recipe *device,int s)

{
  int iVar1;
  int *piVar2;
  int op;
  size_t opsz;
  
  opsz = 4;
  iVar1 = nn_getsockopt(s,0,0xc,&op,&opsz);
  if (iVar1 == 0) {
    if (opsz != 4) {
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","opsz == sizeof (op)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/devices/device.c"
              ,0xd6);
      fflush(_stderr);
      nn_err_abort();
    }
    if (op == 2) {
      do {
        iVar1 = nn_device_mvmsg(device,s,s,0);
      } while (-1 < iVar1);
    }
    else {
      piVar2 = __errno_location();
      *piVar2 = 0x16;
    }
  }
  return -1;
}

Assistant:

int nn_device_loopback (struct nn_device_recipe *device, int s)
{
    int rc;
    int op;
    size_t opsz;

    /*  Check whether the socket is a "raw" socket. */
    opsz = sizeof (op);
    rc = nn_getsockopt (s, NN_SOL_SOCKET, NN_DOMAIN, &op, &opsz);
    if (nn_slow (rc != 0))
        return -1;
    nn_assert (opsz == sizeof (op));
    if (op != AF_SP_RAW) {
        errno = EINVAL;
        return -1;
    }

    for (;;) {
        rc = nn_device_mvmsg (device, s, s, 0);
        if (nn_slow (rc < 0))
            return -1;
    }
}